

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::addAndRenameFormFields
          (QPDFAcroFormDocumentHelper *this,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *fields)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  QPDFObjGen og;
  reference __x;
  size_type sVar3;
  mapped_type *pmVar4;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  allocator<char> local_232;
  allocator<char> local_231;
  string *local_230;
  int local_224;
  QPDFAcroFormDocumentHelper *local_220;
  string append_1;
  QPDFObjectHandle kids;
  string new_name;
  QPDFObjectHandle local_1c0;
  QPDFObjectHandle local_1b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  iterator __begin4;
  element_type *local_150;
  string local_140;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_120;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  renames;
  string local_e0 [32];
  set seen;
  iterator __end4;
  QPDFFormFieldObjectHelper local_68;
  
  local_220 = this;
  analyze(this);
  renames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &renames._M_t._M_impl.super__Rb_tree_header._M_header;
  renames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  renames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  renames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left =
       &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  renames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       renames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right =
       seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
       super__Rb_tree_header._M_header._M_left;
  std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  list<__gnu_cxx::__normal_iterator<QPDFObjectHandle*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>,void>
            ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&queue,
             (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&__begin4);
  while( true ) {
    if (queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&queue) break;
    local_230 = (string *)
                (queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                 ._M_node.super__List_node_base._M_next + 1);
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_230);
    bVar2 = QPDFObjGen::set::add(&seen,og);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"/Kids",(allocator<char> *)&__end4);
      QPDFObjectHandle::getKey(&kids,local_230);
      std::__cxx11::string::~string((string *)&__begin4);
      bVar2 = QPDFObjectHandle::isArray(&kids);
      if (bVar2) {
        QPDFObjectHandle::aitems((QPDFObjectHandle *)&new_name);
        QPDFObjectHandle::QPDFArrayItems::begin(&__begin4,(QPDFArrayItems *)&new_name);
        QPDFObjectHandle::QPDFArrayItems::end(&__end4,(QPDFArrayItems *)&new_name);
        while( true ) {
          bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=(&__begin4,&__end4);
          if (!bVar2) break;
          __x = QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&__begin4);
          std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&queue,__x);
          QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&__begin4);
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__end4);
        QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__begin4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_name._M_string_length);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"/T",(allocator<char> *)&__end4);
      bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_230,(string *)&__begin4);
      std::__cxx11::string::~string((string *)&__begin4);
      if (bVar2) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_230);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&__begin4,(QPDFObjectHandle *)&local_1a0);
        QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
                  ((string *)&__end4,(QPDFFormFieldObjectHelper *)&__begin4);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&__begin4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&renames,(key_type *)&__end4);
        if (sVar3 == 0) {
          std::__cxx11::string::string((string *)&new_name,(string *)&__end4);
          append_1._M_dataplus._M_p = (pointer)&append_1.field_2;
          append_1._M_string_length = 0;
          append_1.field_2._M_local_buf[0] = '\0';
          local_224 = 1;
          while( true ) {
            getFieldsWithQualifiedName
                      ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                       &__begin4,local_220,&new_name);
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                         *)&__begin4);
            if (local_150 == (element_type *)0x0) break;
            std::__cxx11::to_string(&local_140,local_224);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,"+",&local_140);
            std::__cxx11::string::operator=((string *)&append_1,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
            std::__cxx11::string::~string((string *)&local_140);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__end4,&append_1);
            std::__cxx11::string::operator=((string *)&new_name,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
            local_224 = local_224 + 1;
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&renames,(key_type *)&__end4);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&append_1);
          std::__cxx11::string::~string((string *)&new_name);
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&renames,(key_type *)&__end4);
        std::__cxx11::string::string((string *)&__begin4,(string *)pmVar4);
        if (__begin4.m.
            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&new_name,"/T",&local_231);
          std::__cxx11::string::string<std::allocator<char>>(local_e0,"/T",&local_232);
          QPDFObjectHandle::getKey(&local_1c0,local_230);
          QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_140,&local_1c0);
          std::operator+(&append_1,&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__begin4);
          QPDFObjectHandle::newUnicodeString(&local_1b0,&append_1);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_230,&new_name,&local_1b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&append_1);
          std::__cxx11::string::~string((string *)&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1c0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string((string *)&new_name);
        }
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_front(&queue);
  }
  std::__cxx11::_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_clear
            (&queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>);
  p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_120,p_Var5);
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,(QPDFObjectHandle *)&local_120);
    addFormField(local_220,&local_68);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)&seen);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&renames._M_t);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::addAndRenameFormFields(std::vector<QPDFObjectHandle> fields)
{
    analyze();
    std::map<std::string, std::string> renames;
    QPDFObjGen::set seen;
    for (std::list<QPDFObjectHandle> queue{fields.begin(), fields.end()}; !queue.empty();
         queue.pop_front()) {
        auto& obj = queue.front();
        if (seen.add(obj)) {
            auto kids = obj.getKey("/Kids");
            if (kids.isArray()) {
                for (auto const& kid: kids.aitems()) {
                    queue.push_back(kid);
                }
            }

            if (obj.hasKey("/T")) {
                // Find something we can append to the partial name that makes the fully qualified
                // name unique. When we find something, reuse the same suffix for all fields in this
                // group with the same name. We can only change the name of fields that have /T, and
                // this field's /T is always at the end of the fully qualified name, appending to /T
                // has the effect of appending the same thing to the fully qualified name.
                std::string old_name = QPDFFormFieldObjectHelper(obj).getFullyQualifiedName();
                if (renames.count(old_name) == 0) {
                    std::string new_name = old_name;
                    int suffix = 0;
                    std::string append;
                    while (!getFieldsWithQualifiedName(new_name).empty()) {
                        ++suffix;
                        append = "+" + std::to_string(suffix);
                        new_name = old_name + append;
                    }
                    renames[old_name] = append;
                }
                std::string append = renames[old_name];
                if (!append.empty()) {
                    obj.replaceKey(
                        "/T",
                        QPDFObjectHandle::newUnicodeString(
                            obj.getKey("/T").getUTF8Value() + append));
                }
            }
        }
    }

    for (auto const& i: fields) {
        addFormField(i);
    }
}